

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string * __thiscall helics::helicsComplexString_abi_cxx11_(double real,double imag)

{
  string *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  basic_string_view<char> bVar1;
  undefined1 in_stack_00000080 [16];
  undefined1 in_stack_00000090 [16];
  int ignore;
  string_view sv;
  int ignore_1;
  string_view sv_1;
  undefined1 local_1b9;
  char *local_1b8;
  size_t local_1b0;
  undefined1 local_1a1;
  char *local_1a0;
  size_t local_198;
  undefined1 local_190 [8];
  undefined8 local_188 [2];
  undefined8 local_178 [2];
  undefined1 local_168 [24];
  undefined8 local_150;
  undefined8 *local_148;
  char *local_140;
  size_t local_138;
  undefined1 *local_130;
  undefined8 *local_128;
  char *local_120;
  size_t local_118;
  int local_104;
  char *local_100;
  undefined8 local_f8;
  undefined1 *local_e8;
  char **local_e0;
  undefined8 local_d8 [3];
  undefined8 local_c0;
  undefined8 *local_b8;
  char *local_b0;
  size_t local_a8;
  undefined8 *local_a0;
  char *local_98;
  size_t local_90;
  int local_7c;
  char *local_78;
  undefined8 local_70;
  undefined1 *local_60;
  char **local_58;
  undefined8 *local_48;
  undefined1 *local_38;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_188[0] = in_XMM0_Qa;
  if (((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) != 0.0) ||
     (NAN((double)CONCAT44(in_XMM1_Db,in_XMM1_Da)))) {
    helicsComplexString::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_RDI);
    local_e0 = &local_1a0;
    local_e8 = &local_1a1;
    bVar1 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x348479);
    local_198 = bVar1.size_;
    local_1a0 = bVar1.data_;
    local_100 = "[{},{}]";
    local_f8 = 7;
    local_104 = 0;
    ::fmt::v11::detail::ignore_unused<int>(&local_104);
    local_120 = local_1a0;
    local_118 = local_198;
    local_128 = local_188;
    local_130 = local_190;
    local_140 = local_1a0;
    local_138 = local_198;
    local_28 = local_178;
    local_178[0] = local_188[0];
    local_38 = local_168;
    local_18 = &local_150;
    local_20 = local_178;
    local_150 = 0xaa;
    local_148 = local_20;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000090,(format_args)in_stack_00000080);
  }
  else {
    helicsComplexString::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)in_RDI);
    local_58 = &local_1b8;
    local_60 = &local_1b9;
    bVar1 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x348631);
    local_1b0 = bVar1.size_;
    local_1b8 = bVar1.data_;
    local_78 = "{}";
    local_70 = 2;
    local_7c = 0;
    ::fmt::v11::detail::ignore_unused<int>(&local_7c);
    local_98 = local_1b8;
    local_90 = local_1b0;
    local_a0 = local_188;
    local_b0 = local_1b8;
    local_a8 = local_1b0;
    local_48 = local_d8;
    local_d8[0] = local_188[0];
    local_8 = &local_c0;
    local_10 = local_d8;
    local_c0 = 10;
    local_b8 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000090,(format_args)in_stack_00000080);
  }
  return in_RDI;
}

Assistant:

std::string helicsComplexString(double real, double imag)
{
    return (imag != 0.0) ? fmt::format(FMT_STRING("[{},{}]"), real, imag) :
                           fmt::format(FMT_STRING("{}"), real);
}